

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::RadixHTConfig::RadixHTConfig(RadixHTConfig *this,RadixHTGlobalSinkState *sink_p)

{
  type pTVar1;
  idx_t iVar2;
  
  this->sink = sink_p;
  this->number_of_threads = sink_p->number_of_threads;
  pTVar1 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(&sink_p->radix_ht->layout_ptr);
  this->row_width = pTVar1->row_width;
  iVar2 = SinkCapacity(this);
  this->sink_capacity = iVar2;
  iVar2 = InitialSinkRadixBits(this);
  (this->sink_radix_bits).super___atomic_base<unsigned_long>._M_i = iVar2;
  iVar2 = MaximumSinkRadixBits(this);
  this->maximum_sink_radix_bits = iVar2;
  return;
}

Assistant:

RadixHTConfig::RadixHTConfig(RadixHTGlobalSinkState &sink_p)
    : sink(sink_p), number_of_threads(sink.number_of_threads), row_width(sink.radix_ht.GetLayout().GetRowWidth()),
      sink_capacity(SinkCapacity()), sink_radix_bits(InitialSinkRadixBits()),
      maximum_sink_radix_bits(MaximumSinkRadixBits()) {
}